

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

AdsHandle * __thiscall
AdsDevice::OpenFile(AdsHandle *__return_storage_ptr__,AdsDevice *this,string *filename,
                   uint32_t flags)

{
  size_t writeLength;
  void *writeData;
  AdsException *this_00;
  pointer __p;
  AdsDevice *local_b8;
  code *local_b0;
  undefined8 local_a8;
  type local_a0;
  function<long_(unsigned_int)> local_88;
  ResourceDeleter<unsigned_int> local_68;
  long local_38;
  long error;
  uint32_t local_28;
  uint32_t handle;
  uint32_t bytesRead;
  uint32_t flags_local;
  string *filename_local;
  AdsDevice *this_local;
  
  local_28 = 0;
  handle = flags;
  _bytesRead = filename;
  filename_local = (string *)this;
  this_local = (AdsDevice *)__return_storage_ptr__;
  writeLength = std::__cxx11::string::length();
  writeData = (void *)std::__cxx11::string::c_str();
  local_38 = ReadWriteReqEx2(this,0x78,flags,4,(void *)((long)&error + 4),writeLength,writeData,
                             &local_28);
  if (local_38 != 0) {
    this_00 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(this_00,local_38);
    __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
  }
  error._4_4_ = bhf::ads::letoh<unsigned_int>((uint *)((long)&error + 4));
  __p = (pointer)operator_new(4);
  *__p = error._4_4_;
  local_b0 = CloseFile;
  local_a8 = 0;
  local_b8 = this;
  std::bind<long(AdsDevice::*)(unsigned_int)const,AdsDevice_const*,std::_Placeholder<1>const&>
            (&local_a0,(offset_in_AdsDevice_to_subr *)&local_b0,&local_b8,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<long(unsigned_int)>::
  function<std::_Bind<long(AdsDevice::*(AdsDevice_const*,std::_Placeholder<1>))(unsigned_int)const>,void>
            ((function<long(unsigned_int)> *)&local_88,&local_a0);
  ResourceDeleter<unsigned_int>::ResourceDeleter(&local_68,&local_88);
  std::unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>>::
  unique_ptr<ResourceDeleter<unsigned_int>,void>
            ((unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>> *)__return_storage_ptr__,__p,
             &local_68);
  ResourceDeleter<unsigned_int>::~ResourceDeleter(&local_68);
  std::function<long_(unsigned_int)>::~function(&local_88);
  return __return_storage_ptr__;
}

Assistant:

AdsHandle AdsDevice::OpenFile(const std::string& filename, const uint32_t flags) const
{
    uint32_t bytesRead = 0;
    uint32_t handle;
    const auto error = ReadWriteReqEx2(SYSTEMSERVICE_FOPEN,
                                       flags,
                                       sizeof(handle),
                                       &handle,
                                       filename.length(),
                                       filename.c_str(),
                                       &bytesRead);

    if (error) {
        throw AdsException(error);
    }
    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::CloseFile, this, std::placeholders::_1)}};
}